

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_std_file_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue obj;
  JSRuntime *rt_00;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSSTDFile *s;
  void *in_stack_ffffffffffffffd8;
  
  obj.tag = in_RDX;
  obj.u.float64 = in_RSI.float64;
  rt_00 = (JSRuntime *)JS_GetOpaque(obj,js_std_file_class_id);
  if (rt_00 != (JSRuntime *)0x0) {
    if (((rt_00->mf).js_malloc != (_func_void_ptr_JSMallocState_ptr_size_t *)0x0) &&
       (*(int *)&(rt_00->mf).js_free != 0)) {
      if (*(int *)((long)&(rt_00->mf).js_free + 4) == 0) {
        fclose((FILE *)(rt_00->mf).js_malloc);
      }
      else {
        pclose((FILE *)(rt_00->mf).js_malloc);
      }
    }
    js_free_rt(rt_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void js_std_file_finalizer(JSRuntime *rt, JSValue val)
{
    JSSTDFile *s = JS_GetOpaque(val, js_std_file_class_id);
    if (s) {
        if (s->f && s->close_in_finalizer) {
            if (s->is_popen)
                pclose(s->f);
            else
                fclose(s->f);
        }
        js_free_rt(rt, s);
    }
}